

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O1

Result __thiscall
wabt::BinaryReaderLogging::OnBrTableExpr
          (BinaryReaderLogging *this,Index num_targets,Index *target_depths,
          Index default_target_depth)

{
  ulong uVar1;
  Enum EVar2;
  ulong uVar3;
  
  uVar1 = (ulong)num_targets;
  WriteIndent(this);
  Stream::Writef(this->stream_,"OnBrTableExpr(num_targets: %u, depths: [",uVar1);
  if (num_targets != 0) {
    uVar3 = 0;
    do {
      Stream::Writef(this->stream_,"%u",(ulong)target_depths[uVar3]);
      if (num_targets - 1 != uVar3) {
        Stream::Writef(this->stream_,", ");
      }
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  Stream::Writef(this->stream_,"], default: %u)\n",(ulong)default_target_depth);
  EVar2 = (*this->reader_->_vptr_BinaryReaderDelegate[0x4d])
                    (this->reader_,uVar1,target_depths,(ulong)default_target_depth);
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderLogging::OnBrTableExpr(Index num_targets,
                                          Index* target_depths,
                                          Index default_target_depth) {
  LOGF("OnBrTableExpr(num_targets: %" PRIindex ", depths: [", num_targets);
  for (Index i = 0; i < num_targets; ++i) {
    LOGF_NOINDENT("%" PRIindex, target_depths[i]);
    if (i != num_targets - 1) {
      LOGF_NOINDENT(", ");
    }
  }
  LOGF_NOINDENT("], default: %" PRIindex ")\n", default_target_depth);
  return reader_->OnBrTableExpr(num_targets, target_depths,
                                default_target_depth);
}